

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

void proto2_unittest::TestAllTypesLite::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ulong uVar4;
  _func_int **pp_Var5;
  MessageLite *pMVar6;
  char *failure_msg;
  void *pvVar7;
  MessageLite *pMVar8;
  int line;
  Arena *pAVar9;
  string *value;
  Arena *arena;
  TestAllTypesLite *_this;
  TestAllTypesLite *local_38;
  MessageLite *local_30 [2];
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  local_38 = (TestAllTypesLite *)to_msg;
  local_30[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto2_unittest::TestAllTypesLite_const*,proto2_unittest::TestAllTypesLite*>
                          ((TestAllTypesLite **)local_30,&local_38,"&from != _this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    line = 0x10b4;
LAB_00186ed5:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_lite.pb.cc"
               ,line,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_30)
    ;
  }
  google::protobuf::RepeatedField<int>::MergeFrom
            (&(local_38->field_0)._impl_.repeated_int32_,(RepeatedField<int> *)(from_msg + 2));
  google::protobuf::RepeatedField<long>::MergeFrom
            (&(local_38->field_0)._impl_.repeated_int64_,(RepeatedField<long> *)(from_msg + 3));
  google::protobuf::RepeatedField<unsigned_int>::MergeFrom
            (&(local_38->field_0)._impl_.repeated_uint32_,
             (RepeatedField<unsigned_int> *)(from_msg + 4));
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom
            (&(local_38->field_0)._impl_.repeated_uint64_,
             (RepeatedField<unsigned_long> *)(from_msg + 5));
  google::protobuf::RepeatedField<int>::MergeFrom
            (&(local_38->field_0)._impl_.repeated_sint32_,(RepeatedField<int> *)(from_msg + 6));
  google::protobuf::RepeatedField<long>::MergeFrom
            (&(local_38->field_0)._impl_.repeated_sint64_,(RepeatedField<long> *)(from_msg + 7));
  google::protobuf::RepeatedField<unsigned_int>::MergeFrom
            (&(local_38->field_0)._impl_.repeated_fixed32_,
             (RepeatedField<unsigned_int> *)(from_msg + 8));
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom
            (&(local_38->field_0)._impl_.repeated_fixed64_,
             (RepeatedField<unsigned_long> *)(from_msg + 9));
  google::protobuf::RepeatedField<int>::MergeFrom
            (&(local_38->field_0)._impl_.repeated_sfixed32_,(RepeatedField<int> *)(from_msg + 10));
  google::protobuf::RepeatedField<long>::MergeFrom
            (&(local_38->field_0)._impl_.repeated_sfixed64_,(RepeatedField<long> *)(from_msg + 0xb))
  ;
  google::protobuf::RepeatedField<float>::MergeFrom
            (&(local_38->field_0)._impl_.repeated_float_,(RepeatedField<float> *)(from_msg + 0xc));
  google::protobuf::RepeatedField<double>::MergeFrom
            (&(local_38->field_0)._impl_.repeated_double_,(RepeatedField<double> *)(from_msg + 0xd))
  ;
  google::protobuf::RepeatedField<bool>::MergeFrom
            (&(local_38->field_0)._impl_.repeated_bool_,(RepeatedField<bool> *)(from_msg + 0xe));
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&(local_38->field_0)._impl_.repeated_string_,
              (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(from_msg + 0xf));
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&(local_38->field_0)._impl_.repeated_bytes_,
              (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&from_msg[0x10]._internal_metadata_);
  google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite_RepeatedGroup>::MergeFrom
            (&(local_38->field_0)._impl_.repeatedgroup_,
             (RepeatedPtrField<proto2_unittest::TestAllTypesLite_RepeatedGroup> *)(from_msg + 0x12))
  ;
  google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite_NestedMessage>::MergeFrom
            (&(local_38->field_0)._impl_.repeated_nested_message_,
             (RepeatedPtrField<proto2_unittest::TestAllTypesLite_NestedMessage> *)
             &from_msg[0x13]._internal_metadata_);
  google::protobuf::RepeatedPtrField<proto2_unittest::ForeignMessageLite>::MergeFrom
            (&(local_38->field_0)._impl_.repeated_foreign_message_,
             (RepeatedPtrField<proto2_unittest::ForeignMessageLite> *)(from_msg + 0x15));
  google::protobuf::RepeatedPtrField<proto2_unittest_import::ImportMessageLite>::MergeFrom
            (&(local_38->field_0)._impl_.repeated_import_message_,
             (RepeatedPtrField<proto2_unittest_import::ImportMessageLite> *)
             &from_msg[0x16]._internal_metadata_);
  google::protobuf::RepeatedField<int>::MergeFrom
            (&(local_38->field_0)._impl_.repeated_nested_enum_,
             (RepeatedField<int> *)(from_msg + 0x18));
  google::protobuf::RepeatedField<int>::MergeFrom
            (&(local_38->field_0)._impl_.repeated_foreign_enum_,
             (RepeatedField<int> *)(from_msg + 0x19));
  google::protobuf::RepeatedField<int>::MergeFrom
            (&(local_38->field_0)._impl_.repeated_import_enum_,
             (RepeatedField<int> *)(from_msg + 0x1a));
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&(local_38->field_0)._impl_.repeated_string_piece_,
              (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(from_msg + 0x1b));
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&(local_38->field_0)._impl_.repeated_cord_,
              (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&from_msg[0x1c]._internal_metadata_);
  google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite_NestedMessage>::MergeFrom
            (&(local_38->field_0)._impl_.repeated_lazy_message_,
             (RepeatedPtrField<proto2_unittest::TestAllTypesLite_NestedMessage> *)(from_msg + 0x1e))
  ;
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((char)uVar1 != '\0') {
    if ((uVar1 & 1) != 0) {
      uVar4 = from_msg[0x1f]._internal_metadata_.ptr_;
      (local_38->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_38->field_0)._impl_._has_bits_.has_bits_[0] | 1;
      pAVar9 = (Arena *)(local_38->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pAVar9 & 1) != 0) {
        pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(local_38->field_0)._impl_.optional_string_,(string *)(uVar4 & 0xfffffffffffffffc)
                 ,pAVar9);
    }
    if ((uVar1 & 2) != 0) {
      pp_Var5 = from_msg[0x20]._vptr_MessageLite;
      (local_38->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_38->field_0)._impl_._has_bits_.has_bits_[0] | 2;
      pAVar9 = (Arena *)(local_38->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pAVar9 & 1) != 0) {
        pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(local_38->field_0)._impl_.optional_bytes_,
                 (string *)((ulong)pp_Var5 & 0xfffffffffffffffc),pAVar9);
    }
    if ((uVar1 & 4) != 0) {
      uVar4 = from_msg[0x20]._internal_metadata_.ptr_;
      (local_38->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_38->field_0)._impl_._has_bits_.has_bits_[0] | 4;
      pAVar9 = (Arena *)(local_38->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pAVar9 & 1) != 0) {
        pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(local_38->field_0)._impl_.optional_string_piece_,
                 (string *)(uVar4 & 0xfffffffffffffffc),pAVar9);
    }
    if ((uVar1 & 8) != 0) {
      pp_Var5 = from_msg[0x21]._vptr_MessageLite;
      (local_38->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_38->field_0)._impl_._has_bits_.has_bits_[0] | 8;
      pAVar9 = (Arena *)(local_38->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pAVar9 & 1) != 0) {
        pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(local_38->field_0)._impl_.optional_cord_,
                 (string *)((ulong)pp_Var5 & 0xfffffffffffffffc),pAVar9);
    }
    if ((uVar1 & 0x10) != 0) {
      pMVar8 = (MessageLite *)from_msg[0x21]._internal_metadata_.ptr_;
      if (pMVar8 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.optionalgroup_ != nullptr";
        line = 0x10e5;
        goto LAB_00186ed5;
      }
      pMVar6 = *(MessageLite **)((long)&local_38->field_0 + 0x208);
      if (pMVar6 == (MessageLite *)0x0) {
        pvVar7 = google::protobuf::Arena::
                 CopyConstruct<proto2_unittest::TestAllTypesLite_OptionalGroup>(arena,pMVar8);
        *(void **)((long)&local_38->field_0 + 0x208) = pvVar7;
      }
      else {
        TestAllTypesLite_OptionalGroup::MergeImpl(pMVar6,pMVar8);
      }
    }
    if ((uVar1 & 0x20) != 0) {
      pMVar8 = (MessageLite *)from_msg[0x22]._vptr_MessageLite;
      if (pMVar8 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.optional_nested_message_ != nullptr";
        line = 0x10ed;
        goto LAB_00186ed5;
      }
      pMVar6 = *(MessageLite **)((long)&local_38->field_0 + 0x210);
      if (pMVar6 == (MessageLite *)0x0) {
        pvVar7 = google::protobuf::Arena::
                 CopyConstruct<proto2_unittest::TestAllTypesLite_NestedMessage>(arena,pMVar8);
        *(void **)((long)&local_38->field_0 + 0x210) = pvVar7;
      }
      else {
        TestAllTypesLite_NestedMessage::MergeImpl(pMVar6,pMVar8);
      }
    }
    if ((uVar1 & 0x40) != 0) {
      pMVar8 = (MessageLite *)from_msg[0x22]._internal_metadata_.ptr_;
      if (pMVar8 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.optional_foreign_message_ != nullptr";
        line = 0x10f5;
        goto LAB_00186ed5;
      }
      pMVar6 = *(MessageLite **)((long)&local_38->field_0 + 0x218);
      if (pMVar6 == (MessageLite *)0x0) {
        pvVar7 = google::protobuf::Arena::CopyConstruct<proto2_unittest::ForeignMessageLite>
                           (arena,pMVar8);
        *(void **)((long)&local_38->field_0 + 0x218) = pvVar7;
      }
      else {
        ForeignMessageLite::MergeImpl(pMVar6,pMVar8);
      }
    }
    if ((char)uVar1 < '\0') {
      pMVar8 = (MessageLite *)from_msg[0x23]._vptr_MessageLite;
      if (pMVar8 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.optional_import_message_ != nullptr";
        line = 0x10fd;
        goto LAB_00186ed5;
      }
      pMVar6 = *(MessageLite **)((long)&local_38->field_0 + 0x220);
      if (pMVar6 == (MessageLite *)0x0) {
        pvVar7 = google::protobuf::Arena::CopyConstruct<proto2_unittest_import::ImportMessageLite>
                           (arena,pMVar8);
        *(void **)((long)&local_38->field_0 + 0x220) = pvVar7;
      }
      else {
        proto2_unittest_import::ImportMessageLite::MergeImpl(pMVar6,pMVar8);
      }
    }
  }
  if ((uVar1 & 0xff00) != 0) {
    if ((uVar1 >> 8 & 1) != 0) {
      pMVar8 = (MessageLite *)from_msg[0x23]._internal_metadata_.ptr_;
      if (pMVar8 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.optional_public_import_message_ != nullptr";
        line = 0x1107;
        goto LAB_00186ed5;
      }
      pMVar6 = *(MessageLite **)((long)&local_38->field_0 + 0x228);
      if (pMVar6 == (MessageLite *)0x0) {
        pvVar7 = google::protobuf::Arena::
                 CopyConstruct<proto2_unittest_import::PublicImportMessageLite>(arena,pMVar8);
        *(void **)((long)&local_38->field_0 + 0x228) = pvVar7;
      }
      else {
        proto2_unittest_import::PublicImportMessageLite::MergeImpl(pMVar6,pMVar8);
      }
    }
    if ((uVar1 >> 9 & 1) != 0) {
      pMVar8 = (MessageLite *)from_msg[0x24]._vptr_MessageLite;
      if (pMVar8 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.optional_lazy_message_ != nullptr";
        line = 0x110f;
        goto LAB_00186ed5;
      }
      pMVar6 = *(MessageLite **)((long)&local_38->field_0 + 0x230);
      if (pMVar6 == (MessageLite *)0x0) {
        pvVar7 = google::protobuf::Arena::
                 CopyConstruct<proto2_unittest::TestAllTypesLite_NestedMessage>(arena,pMVar8);
        *(void **)((long)&local_38->field_0 + 0x230) = pvVar7;
      }
      else {
        TestAllTypesLite_NestedMessage::MergeImpl(pMVar6,pMVar8);
      }
    }
    if ((uVar1 >> 10 & 1) != 0) {
      pMVar8 = (MessageLite *)from_msg[0x24]._internal_metadata_.ptr_;
      if (pMVar8 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.optional_unverified_lazy_message_ != nullptr";
        line = 0x1117;
        goto LAB_00186ed5;
      }
      pMVar6 = *(MessageLite **)((long)&local_38->field_0 + 0x238);
      if (pMVar6 == (MessageLite *)0x0) {
        pvVar7 = google::protobuf::Arena::
                 CopyConstruct<proto2_unittest::TestAllTypesLite_NestedMessage>(arena,pMVar8);
        *(void **)((long)&local_38->field_0 + 0x238) = pvVar7;
      }
      else {
        TestAllTypesLite_NestedMessage::MergeImpl(pMVar6,pMVar8);
      }
    }
    if ((uVar1 >> 0xb & 1) != 0) {
      *(_func_int ***)((long)&local_38->field_0 + 0x240) = from_msg[0x25]._vptr_MessageLite;
    }
    if ((uVar1 >> 0xc & 1) != 0) {
      *(int *)((long)&local_38->field_0 + 0x248) = (int)from_msg[0x25]._internal_metadata_.ptr_;
    }
    if ((uVar1 >> 0xd & 1) != 0) {
      (local_38->field_0)._impl_.optional_uint32_ =
           *(uint32_t *)((long)&from_msg[0x25]._internal_metadata_.ptr_ + 4);
    }
    if ((uVar1 >> 0xe & 1) != 0) {
      *(_func_int ***)((long)&local_38->field_0 + 0x250) = from_msg[0x26]._vptr_MessageLite;
    }
    if ((short)uVar1 < 0) {
      *(intptr_t *)((long)&local_38->field_0 + 600) = from_msg[0x26]._internal_metadata_.ptr_;
    }
  }
  if ((uVar1 & 0xff0000) != 0) {
    if ((uVar1 >> 0x10 & 1) != 0) {
      *(undefined4 *)((long)&local_38->field_0 + 0x260) =
           *(undefined4 *)&from_msg[0x27]._vptr_MessageLite;
    }
    if ((uVar1 >> 0x11 & 1) != 0) {
      (local_38->field_0)._impl_.optional_fixed32_ =
           *(uint32_t *)((long)&from_msg[0x27]._vptr_MessageLite + 4);
    }
    if ((uVar1 >> 0x12 & 1) != 0) {
      *(intptr_t *)((long)&local_38->field_0 + 0x268) = from_msg[0x27]._internal_metadata_.ptr_;
    }
    if ((uVar1 >> 0x13 & 1) != 0) {
      *(_func_int ***)((long)&local_38->field_0 + 0x270) = from_msg[0x28]._vptr_MessageLite;
    }
    if ((uVar1 >> 0x14 & 1) != 0) {
      *(int *)((long)&local_38->field_0 + 0x278) = (int)from_msg[0x28]._internal_metadata_.ptr_;
    }
    if ((uVar1 >> 0x15 & 1) != 0) {
      (local_38->field_0)._impl_.optional_float_ =
           *(float *)((long)&from_msg[0x28]._internal_metadata_.ptr_ + 4);
    }
    if ((uVar1 >> 0x16 & 1) != 0) {
      *(_func_int ***)((long)&local_38->field_0 + 0x280) = from_msg[0x29]._vptr_MessageLite;
    }
    if ((uVar1 >> 0x17 & 1) != 0) {
      *(char *)((long)&local_38->field_0 + 0x288) = (char)from_msg[0x29]._internal_metadata_.ptr_;
    }
  }
  if (0xffffff < uVar1) {
    if ((uVar1 >> 0x18 & 1) != 0) {
      (local_38->field_0)._impl_.optional_import_enum_ =
           *(int *)((long)&from_msg[0x29]._internal_metadata_.ptr_ + 4);
    }
    if ((uVar1 >> 0x19 & 1) != 0) {
      *(undefined4 *)((long)&local_38->field_0 + 0x290) =
           *(undefined4 *)&from_msg[0x2a]._vptr_MessageLite;
    }
    if ((uVar1 >> 0x1a & 1) != 0) {
      (local_38->field_0)._impl_.optional_foreign_enum_ =
           *(int *)((long)&from_msg[0x2a]._vptr_MessageLite + 4);
    }
    if ((uVar1 >> 0x1b & 1) != 0) {
      uVar4 = from_msg[0x2a]._internal_metadata_.ptr_;
      (local_38->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_38->field_0)._impl_._has_bits_.has_bits_[0] | 0x8000000;
      pAVar9 = (Arena *)(local_38->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pAVar9 & 1) != 0) {
        pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(local_38->field_0)._impl_.default_string_,(string *)(uVar4 & 0xfffffffffffffffc),
                 pAVar9);
    }
    if ((uVar1 >> 0x1c & 1) != 0) {
      pp_Var5 = from_msg[0x2b]._vptr_MessageLite;
      (local_38->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_38->field_0)._impl_._has_bits_.has_bits_[0] | 0x10000000;
      pAVar9 = (Arena *)(local_38->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pAVar9 & 1) != 0) {
        pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(local_38->field_0)._impl_.default_bytes_,
                 (string *)((ulong)pp_Var5 & 0xfffffffffffffffc),pAVar9);
    }
    if ((uVar1 >> 0x1d & 1) != 0) {
      uVar4 = from_msg[0x2b]._internal_metadata_.ptr_;
      (local_38->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_38->field_0)._impl_._has_bits_.has_bits_[0] | 0x20000000;
      pAVar9 = (Arena *)(local_38->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pAVar9 & 1) != 0) {
        pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(local_38->field_0)._impl_.default_string_piece_,
                 (string *)(uVar4 & 0xfffffffffffffffc),pAVar9);
    }
    if ((uVar1 >> 0x1e & 1) != 0) {
      pp_Var5 = from_msg[0x2c]._vptr_MessageLite;
      (local_38->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_38->field_0)._impl_._has_bits_.has_bits_[0] | 0x40000000;
      pAVar9 = (Arena *)(local_38->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pAVar9 & 1) != 0) {
        pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(local_38->field_0)._impl_.default_cord_,
                 (string *)((ulong)pp_Var5 & 0xfffffffffffffffc),pAVar9);
    }
    if ((int)uVar1 < 0) {
      _internal_set_optional_bytes_cord(local_38,(Cord *)&from_msg[0x2c]._internal_metadata_);
    }
  }
  uVar1 = *(uint *)((long)&from_msg[1]._vptr_MessageLite + 4);
  if ((char)uVar1 != '\0') {
    if ((uVar1 & 1) != 0) {
      (local_38->field_0)._impl_.deceptively_named_list_ =
           (int32_t)from_msg[0x2d]._internal_metadata_.ptr_;
    }
    if ((uVar1 & 2) != 0) {
      (local_38->field_0)._impl_.default_int64_ = (int64_t)from_msg[0x2e]._vptr_MessageLite;
    }
    if ((uVar1 & 4) != 0) {
      (local_38->field_0)._impl_.default_int32_ = (int32_t)from_msg[0x2e]._internal_metadata_.ptr_;
    }
    if ((uVar1 & 8) != 0) {
      (local_38->field_0)._impl_.default_uint32_ =
           *(uint32_t *)((long)&from_msg[0x2e]._internal_metadata_.ptr_ + 4);
    }
    if ((uVar1 & 0x10) != 0) {
      (local_38->field_0)._impl_.default_uint64_ = (uint64_t)from_msg[0x2f]._vptr_MessageLite;
    }
    if ((uVar1 & 0x20) != 0) {
      (local_38->field_0)._impl_.default_sint64_ = from_msg[0x2f]._internal_metadata_.ptr_;
    }
    if ((uVar1 & 0x40) != 0) {
      (local_38->field_0)._impl_.default_sint32_ = *(int32_t *)&from_msg[0x30]._vptr_MessageLite;
    }
    if ((char)uVar1 < '\0') {
      (local_38->field_0)._impl_.default_fixed32_ =
           *(uint32_t *)((long)&from_msg[0x30]._vptr_MessageLite + 4);
    }
  }
  if ((uVar1 & 0xff00) != 0) {
    if ((uVar1 >> 8 & 1) != 0) {
      (local_38->field_0)._impl_.default_fixed64_ = from_msg[0x30]._internal_metadata_.ptr_;
    }
    if ((uVar1 >> 9 & 1) != 0) {
      (local_38->field_0)._impl_.default_sfixed64_ = (int64_t)from_msg[0x31]._vptr_MessageLite;
    }
    if ((uVar1 >> 10 & 1) != 0) {
      (local_38->field_0)._impl_.default_sfixed32_ =
           (int32_t)from_msg[0x31]._internal_metadata_.ptr_;
    }
    if ((uVar1 >> 0xb & 1) != 0) {
      (local_38->field_0)._impl_.default_float_ =
           *(float *)((long)&from_msg[0x31]._internal_metadata_.ptr_ + 4);
    }
    if ((uVar1 >> 0xc & 1) != 0) {
      (local_38->field_0)._impl_.default_double_ = (double)from_msg[0x32]._vptr_MessageLite;
    }
    if ((uVar1 >> 0xd & 1) != 0) {
      (local_38->field_0)._impl_.default_bool_ = SUB81(from_msg[0x32]._internal_metadata_.ptr_,0);
    }
    if ((uVar1 >> 0xe & 1) != 0) {
      (local_38->field_0)._impl_.default_nested_enum_ =
           *(int *)((long)&from_msg[0x32]._internal_metadata_.ptr_ + 4);
    }
    if ((short)uVar1 < 0) {
      (local_38->field_0)._impl_.default_foreign_enum_ = *(int *)&from_msg[0x33]._vptr_MessageLite;
    }
  }
  if ((uVar1 >> 0x10 & 1) != 0) {
    (local_38->field_0)._impl_.default_import_enum_ =
         *(int *)((long)&from_msg[0x33]._vptr_MessageLite + 4);
  }
  *(ulong *)(local_38->field_0)._impl_._has_bits_.has_bits_ =
       *(ulong *)(local_38->field_0)._impl_._has_bits_.has_bits_ |
       (ulong)from_msg[1]._vptr_MessageLite;
  uVar2 = *(uint32_t *)&from_msg[0x34]._vptr_MessageLite;
  if (uVar2 == 0) goto switchD_00186d00_caseD_74;
  uVar3 = (local_38->field_0)._impl_._oneof_case_[0];
  if (uVar3 != uVar2) {
    if (uVar3 != 0) {
      clear_oneof_field(local_38);
    }
    (local_38->field_0)._impl_._oneof_case_[0] = uVar2;
  }
  switch(uVar2) {
  case 0x6f:
    *(int *)((long)&local_38->field_0 + 0x328) = (int)from_msg[0x33]._internal_metadata_.ptr_;
    break;
  case 0x70:
  case 0x73:
  case 0x75:
    if (uVar3 == uVar2) {
      google::protobuf::MessageLite::CheckTypeAndMergeFrom
                ((local_38->field_0)._impl_.oneof_field_.oneof_nested_message_,
                 (MessageLite *)from_msg[0x33]._internal_metadata_.ptr_);
    }
    else {
      pMVar8 = google::protobuf::MessageLite::CopyConstruct
                         (arena,(MessageLite *)from_msg[0x33]._internal_metadata_.ptr_);
      (local_38->field_0)._impl_.oneof_field_.oneof_nested_message_ = pMVar8;
    }
    break;
  case 0x71:
    if (uVar3 != uVar2) {
      (local_38->field_0)._impl_.oneof_field_.oneof_nested_message_ =
           (MessageLite *)&google::protobuf::internal::fixed_address_empty_string;
    }
    if (*(int *)&from_msg[0x34]._vptr_MessageLite == 0x71) goto LAB_00186d98;
LAB_00186d5e:
    value = (string *)&google::protobuf::internal::fixed_address_empty_string;
    goto LAB_00186da3;
  case 0x72:
    if (uVar3 != uVar2) {
      (local_38->field_0)._impl_.oneof_field_.oneof_nested_message_ =
           (MessageLite *)&google::protobuf::internal::fixed_address_empty_string;
    }
    if (*(int *)&from_msg[0x34]._vptr_MessageLite != 0x72) goto LAB_00186d5e;
LAB_00186d98:
    value = (string *)(from_msg[0x33]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
LAB_00186da3:
    google::protobuf::internal::ArenaStringPtr::Set<>
              (&(local_38->field_0)._impl_.oneof_field_.oneof_string_,value,arena);
  }
switchD_00186d00_caseD_74:
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(local_38->super_MessageLite)._internal_metadata_,&from_msg->_internal_metadata_);
  return;
}

Assistant:

void TestAllTypesLite::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestAllTypesLite*>(&to_msg);
  auto& from = static_cast<const TestAllTypesLite&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestAllTypesLite)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_int32()->MergeFrom(from._internal_repeated_int32());
  _this->_internal_mutable_repeated_int64()->MergeFrom(from._internal_repeated_int64());
  _this->_internal_mutable_repeated_uint32()->MergeFrom(from._internal_repeated_uint32());
  _this->_internal_mutable_repeated_uint64()->MergeFrom(from._internal_repeated_uint64());
  _this->_internal_mutable_repeated_sint32()->MergeFrom(from._internal_repeated_sint32());
  _this->_internal_mutable_repeated_sint64()->MergeFrom(from._internal_repeated_sint64());
  _this->_internal_mutable_repeated_fixed32()->MergeFrom(from._internal_repeated_fixed32());
  _this->_internal_mutable_repeated_fixed64()->MergeFrom(from._internal_repeated_fixed64());
  _this->_internal_mutable_repeated_sfixed32()->MergeFrom(from._internal_repeated_sfixed32());
  _this->_internal_mutable_repeated_sfixed64()->MergeFrom(from._internal_repeated_sfixed64());
  _this->_internal_mutable_repeated_float()->MergeFrom(from._internal_repeated_float());
  _this->_internal_mutable_repeated_double()->MergeFrom(from._internal_repeated_double());
  _this->_internal_mutable_repeated_bool()->MergeFrom(from._internal_repeated_bool());
  _this->_internal_mutable_repeated_string()->MergeFrom(from._internal_repeated_string());
  _this->_internal_mutable_repeated_bytes()->MergeFrom(from._internal_repeated_bytes());
  _this->_internal_mutable_repeatedgroup()->MergeFrom(
      from._internal_repeatedgroup());
  _this->_internal_mutable_repeated_nested_message()->MergeFrom(
      from._internal_repeated_nested_message());
  _this->_internal_mutable_repeated_foreign_message()->MergeFrom(
      from._internal_repeated_foreign_message());
  _this->_internal_mutable_repeated_import_message()->MergeFrom(
      from._internal_repeated_import_message());
  _this->_internal_mutable_repeated_nested_enum()->MergeFrom(from._internal_repeated_nested_enum());
  _this->_internal_mutable_repeated_foreign_enum()->MergeFrom(from._internal_repeated_foreign_enum());
  _this->_internal_mutable_repeated_import_enum()->MergeFrom(from._internal_repeated_import_enum());
  _this->_internal_mutable_repeated_string_piece()->MergeFrom(from._internal_repeated_string_piece());
  _this->_internal_mutable_repeated_cord()->MergeFrom(from._internal_repeated_cord());
  _this->_internal_mutable_repeated_lazy_message()->MergeFrom(
      from._internal_repeated_lazy_message());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_optional_string(from._internal_optional_string());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_optional_bytes(from._internal_optional_bytes());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_optional_string_piece(from._internal_optional_string_piece());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_internal_set_optional_cord(from._internal_optional_cord());
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(from._impl_.optionalgroup_ != nullptr);
      if (_this->_impl_.optionalgroup_ == nullptr) {
        _this->_impl_.optionalgroup_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optionalgroup_);
      } else {
        _this->_impl_.optionalgroup_->MergeFrom(*from._impl_.optionalgroup_);
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      ABSL_DCHECK(from._impl_.optional_nested_message_ != nullptr);
      if (_this->_impl_.optional_nested_message_ == nullptr) {
        _this->_impl_.optional_nested_message_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optional_nested_message_);
      } else {
        _this->_impl_.optional_nested_message_->MergeFrom(*from._impl_.optional_nested_message_);
      }
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      ABSL_DCHECK(from._impl_.optional_foreign_message_ != nullptr);
      if (_this->_impl_.optional_foreign_message_ == nullptr) {
        _this->_impl_.optional_foreign_message_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optional_foreign_message_);
      } else {
        _this->_impl_.optional_foreign_message_->MergeFrom(*from._impl_.optional_foreign_message_);
      }
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      ABSL_DCHECK(from._impl_.optional_import_message_ != nullptr);
      if (_this->_impl_.optional_import_message_ == nullptr) {
        _this->_impl_.optional_import_message_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optional_import_message_);
      } else {
        _this->_impl_.optional_import_message_->MergeFrom(*from._impl_.optional_import_message_);
      }
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      ABSL_DCHECK(from._impl_.optional_public_import_message_ != nullptr);
      if (_this->_impl_.optional_public_import_message_ == nullptr) {
        _this->_impl_.optional_public_import_message_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optional_public_import_message_);
      } else {
        _this->_impl_.optional_public_import_message_->MergeFrom(*from._impl_.optional_public_import_message_);
      }
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      ABSL_DCHECK(from._impl_.optional_lazy_message_ != nullptr);
      if (_this->_impl_.optional_lazy_message_ == nullptr) {
        _this->_impl_.optional_lazy_message_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optional_lazy_message_);
      } else {
        _this->_impl_.optional_lazy_message_->MergeFrom(*from._impl_.optional_lazy_message_);
      }
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      ABSL_DCHECK(from._impl_.optional_unverified_lazy_message_ != nullptr);
      if (_this->_impl_.optional_unverified_lazy_message_ == nullptr) {
        _this->_impl_.optional_unverified_lazy_message_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optional_unverified_lazy_message_);
      } else {
        _this->_impl_.optional_unverified_lazy_message_->MergeFrom(*from._impl_.optional_unverified_lazy_message_);
      }
    }
    if ((cached_has_bits & 0x00000800u) != 0) {
      _this->_impl_.optional_int64_ = from._impl_.optional_int64_;
    }
    if ((cached_has_bits & 0x00001000u) != 0) {
      _this->_impl_.optional_int32_ = from._impl_.optional_int32_;
    }
    if ((cached_has_bits & 0x00002000u) != 0) {
      _this->_impl_.optional_uint32_ = from._impl_.optional_uint32_;
    }
    if ((cached_has_bits & 0x00004000u) != 0) {
      _this->_impl_.optional_uint64_ = from._impl_.optional_uint64_;
    }
    if ((cached_has_bits & 0x00008000u) != 0) {
      _this->_impl_.optional_sint64_ = from._impl_.optional_sint64_;
    }
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    if ((cached_has_bits & 0x00010000u) != 0) {
      _this->_impl_.optional_sint32_ = from._impl_.optional_sint32_;
    }
    if ((cached_has_bits & 0x00020000u) != 0) {
      _this->_impl_.optional_fixed32_ = from._impl_.optional_fixed32_;
    }
    if ((cached_has_bits & 0x00040000u) != 0) {
      _this->_impl_.optional_fixed64_ = from._impl_.optional_fixed64_;
    }
    if ((cached_has_bits & 0x00080000u) != 0) {
      _this->_impl_.optional_sfixed64_ = from._impl_.optional_sfixed64_;
    }
    if ((cached_has_bits & 0x00100000u) != 0) {
      _this->_impl_.optional_sfixed32_ = from._impl_.optional_sfixed32_;
    }
    if ((cached_has_bits & 0x00200000u) != 0) {
      _this->_impl_.optional_float_ = from._impl_.optional_float_;
    }
    if ((cached_has_bits & 0x00400000u) != 0) {
      _this->_impl_.optional_double_ = from._impl_.optional_double_;
    }
    if ((cached_has_bits & 0x00800000u) != 0) {
      _this->_impl_.optional_bool_ = from._impl_.optional_bool_;
    }
  }
  if ((cached_has_bits & 0xff000000u) != 0) {
    if ((cached_has_bits & 0x01000000u) != 0) {
      _this->_impl_.optional_import_enum_ = from._impl_.optional_import_enum_;
    }
    if ((cached_has_bits & 0x02000000u) != 0) {
      _this->_impl_.optional_nested_enum_ = from._impl_.optional_nested_enum_;
    }
    if ((cached_has_bits & 0x04000000u) != 0) {
      _this->_impl_.optional_foreign_enum_ = from._impl_.optional_foreign_enum_;
    }
    if ((cached_has_bits & 0x08000000u) != 0) {
      _this->_internal_set_default_string(from._internal_default_string());
    }
    if ((cached_has_bits & 0x10000000u) != 0) {
      _this->_internal_set_default_bytes(from._internal_default_bytes());
    }
    if ((cached_has_bits & 0x20000000u) != 0) {
      _this->_internal_set_default_string_piece(from._internal_default_string_piece());
    }
    if ((cached_has_bits & 0x40000000u) != 0) {
      _this->_internal_set_default_cord(from._internal_default_cord());
    }
    if ((cached_has_bits & 0x80000000u) != 0) {
      _this->_internal_set_optional_bytes_cord(from._internal_optional_bytes_cord());
    }
  }
  cached_has_bits = from._impl_._has_bits_[1];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_impl_.deceptively_named_list_ = from._impl_.deceptively_named_list_;
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.default_int64_ = from._impl_.default_int64_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.default_int32_ = from._impl_.default_int32_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.default_uint32_ = from._impl_.default_uint32_;
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.default_uint64_ = from._impl_.default_uint64_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.default_sint64_ = from._impl_.default_sint64_;
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_impl_.default_sint32_ = from._impl_.default_sint32_;
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      _this->_impl_.default_fixed32_ = from._impl_.default_fixed32_;
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      _this->_impl_.default_fixed64_ = from._impl_.default_fixed64_;
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      _this->_impl_.default_sfixed64_ = from._impl_.default_sfixed64_;
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      _this->_impl_.default_sfixed32_ = from._impl_.default_sfixed32_;
    }
    if ((cached_has_bits & 0x00000800u) != 0) {
      _this->_impl_.default_float_ = from._impl_.default_float_;
    }
    if ((cached_has_bits & 0x00001000u) != 0) {
      _this->_impl_.default_double_ = from._impl_.default_double_;
    }
    if ((cached_has_bits & 0x00002000u) != 0) {
      _this->_impl_.default_bool_ = from._impl_.default_bool_;
    }
    if ((cached_has_bits & 0x00004000u) != 0) {
      _this->_impl_.default_nested_enum_ = from._impl_.default_nested_enum_;
    }
    if ((cached_has_bits & 0x00008000u) != 0) {
      _this->_impl_.default_foreign_enum_ = from._impl_.default_foreign_enum_;
    }
  }
  if ((cached_has_bits & 0x00010000u) != 0) {
    _this->_impl_.default_import_enum_ = from._impl_.default_import_enum_;
  }
  _this->_impl_._has_bits_.Or(from._impl_._has_bits_);
  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_oneof_field();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kOneofUint32: {
        _this->_impl_.oneof_field_.oneof_uint32_ = from._impl_.oneof_field_.oneof_uint32_;
        break;
      }
      case kOneofNestedMessage: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_nested_message_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.oneof_field_.oneof_nested_message_);
        } else {
          _this->_impl_.oneof_field_.oneof_nested_message_->CheckTypeAndMergeFrom(*from._impl_.oneof_field_.oneof_nested_message_);
        }
        break;
      }
      case kOneofString: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_string_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_string_.Set(from._internal_oneof_string(), arena);
        break;
      }
      case kOneofBytes: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_bytes_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_bytes_.Set(from._internal_oneof_bytes(), arena);
        break;
      }
      case kOneofLazyNestedMessage: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_lazy_nested_message_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.oneof_field_.oneof_lazy_nested_message_);
        } else {
          _this->_impl_.oneof_field_.oneof_lazy_nested_message_->CheckTypeAndMergeFrom(*from._impl_.oneof_field_.oneof_lazy_nested_message_);
        }
        break;
      }
      case kOneofNestedMessage2: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_nested_message2_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.oneof_field_.oneof_nested_message2_);
        } else {
          _this->_impl_.oneof_field_.oneof_nested_message2_->CheckTypeAndMergeFrom(*from._impl_.oneof_field_.oneof_nested_message2_);
        }
        break;
      }
      case ONEOF_FIELD_NOT_SET:
        break;
    }
  }
  _this->_internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}